

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  DescriptorBuilder *this_00;
  UnknownFieldSet *pUVar1;
  bool bVar2;
  CppType CVar3;
  uint uVar4;
  Type TVar5;
  uint32_t value_00;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint64_t uVar9;
  int64_t iVar10;
  string *this_01;
  FileDescriptor *this_02;
  DescriptorPool *pDVar11;
  DescriptorPool *pDVar12;
  DescriptorStringView psVar13;
  EnumDescriptor *pEVar14;
  string *psVar15;
  double dVar16;
  undefined1 auVar17 [16];
  string_view sVar18;
  float local_2e0;
  anon_class_8_1_8974feae local_258;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_250;
  anon_class_16_2_f9f82c42 local_240;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_230;
  string_view local_220;
  int local_20c;
  anon_class_24_3_5beeb5f8 local_208;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_1f0;
  EnumValueDescriptor *local_1e0;
  EnumValueDescriptor *candidate_descriptor;
  char *local_1d0;
  Symbol local_1c8;
  Symbol symbol;
  string local_1b0 [8];
  string fully_qualified_name;
  EnumValueDescriptor *enum_value;
  string *value_name;
  EnumDescriptor *enum_type;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_170;
  anon_class_8_1_8974feae local_160;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_158;
  anon_class_8_1_8974feae local_148;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_140;
  uint64_t local_130;
  uint64_t value;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_120;
  double local_110;
  double value_2;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_100;
  float local_ec;
  anon_class_8_1_8974feae aStack_e8;
  float value_1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_e0;
  anon_class_8_1_8974feae local_d0;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_c8;
  anon_class_8_1_8974feae local_b8;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_b0;
  anon_class_8_1_8974feae local_a0;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_98;
  anon_class_8_1_8974feae local_88;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_80;
  anon_class_8_1_8974feae local_70;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_68;
  anon_class_8_1_8974feae local_58;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_50;
  anon_class_8_1_8974feae local_40;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_38;
  UnknownFieldSet *local_28;
  UnknownFieldSet *unknown_fields_local;
  FieldDescriptor *option_field_local;
  OptionInterpreter *this_local;
  
  local_28 = unknown_fields;
  unknown_fields_local = (UnknownFieldSet *)option_field;
  option_field_local = (FieldDescriptor *)this;
  CVar3 = FieldDescriptor::cpp_type(option_field);
  switch(CVar3) {
  case CPPTYPE_INT32:
    bVar2 = UninterpretedOption::has_positive_int_value(this->uninterpreted_option_);
    if (bVar2) {
      uVar9 = UninterpretedOption::positive_int_value(this->uninterpreted_option_);
      iVar7 = std::numeric_limits<int>::max();
      if ((ulong)(long)iVar7 < uVar9) {
        local_40.option_field = (FieldDescriptor **)&unknown_fields_local;
        absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__0,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_38,&local_40);
        this_local._7_1_ = AddValueError(this,local_38);
        goto LAB_0025cc0e;
      }
      iVar7 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
      uVar9 = UninterpretedOption::positive_int_value(this->uninterpreted_option_);
      TVar5 = FieldDescriptor::type((FieldDescriptor *)unknown_fields_local);
      SetInt32(this,iVar7,(int32_t)uVar9,TVar5,local_28);
    }
    else {
      bVar2 = UninterpretedOption::has_negative_int_value(this->uninterpreted_option_);
      if (!bVar2) {
        local_70.option_field = (FieldDescriptor **)&unknown_fields_local;
        absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__2,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_68,&local_70);
        this_local._7_1_ = AddValueError(this,local_68);
        goto LAB_0025cc0e;
      }
      iVar10 = UninterpretedOption::negative_int_value(this->uninterpreted_option_);
      iVar7 = std::numeric_limits<int>::min();
      if (iVar10 < iVar7) {
        local_58.option_field = (FieldDescriptor **)&unknown_fields_local;
        absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__1,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_50,&local_58);
        this_local._7_1_ = AddValueError(this,local_50);
        goto LAB_0025cc0e;
      }
      iVar7 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
      iVar10 = UninterpretedOption::negative_int_value(this->uninterpreted_option_);
      TVar5 = FieldDescriptor::type((FieldDescriptor *)unknown_fields_local);
      SetInt32(this,iVar7,(int32_t)iVar10,TVar5,local_28);
    }
    break;
  case CPPTYPE_INT64:
    bVar2 = UninterpretedOption::has_positive_int_value(this->uninterpreted_option_);
    if (bVar2) {
      uVar9 = UninterpretedOption::positive_int_value(this->uninterpreted_option_);
      uVar8 = std::numeric_limits<long>::max();
      if (uVar8 < uVar9) {
        local_88.option_field = (FieldDescriptor **)&unknown_fields_local;
        absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__3,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_80,&local_88);
        this_local._7_1_ = AddValueError(this,local_80);
        goto LAB_0025cc0e;
      }
      iVar7 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
      uVar9 = UninterpretedOption::positive_int_value(this->uninterpreted_option_);
      TVar5 = FieldDescriptor::type((FieldDescriptor *)unknown_fields_local);
      SetInt64(this,iVar7,uVar9,TVar5,local_28);
    }
    else {
      bVar2 = UninterpretedOption::has_negative_int_value(this->uninterpreted_option_);
      if (!bVar2) {
        local_a0.option_field = (FieldDescriptor **)&unknown_fields_local;
        absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__4,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_98,&local_a0);
        this_local._7_1_ = AddValueError(this,local_98);
        goto LAB_0025cc0e;
      }
      iVar7 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
      iVar10 = UninterpretedOption::negative_int_value(this->uninterpreted_option_);
      TVar5 = FieldDescriptor::type((FieldDescriptor *)unknown_fields_local);
      SetInt64(this,iVar7,iVar10,TVar5,local_28);
    }
    break;
  case CPPTYPE_UINT32:
    bVar2 = UninterpretedOption::has_positive_int_value(this->uninterpreted_option_);
    if (!bVar2) {
      local_d0.option_field = (FieldDescriptor **)&unknown_fields_local;
      absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__6,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_c8,&local_d0);
      this_local._7_1_ = AddValueError(this,local_c8);
      goto LAB_0025cc0e;
    }
    uVar9 = UninterpretedOption::positive_int_value(this->uninterpreted_option_);
    uVar4 = std::numeric_limits<unsigned_int>::max();
    if (uVar4 < uVar9) {
      local_b8.option_field = (FieldDescriptor **)&unknown_fields_local;
      absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__5,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_b0,&local_b8);
      this_local._7_1_ = AddValueError(this,local_b0);
      goto LAB_0025cc0e;
    }
    iVar7 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
    uVar9 = UninterpretedOption::positive_int_value(this->uninterpreted_option_);
    TVar5 = FieldDescriptor::type((FieldDescriptor *)unknown_fields_local);
    SetUInt32(this,iVar7,(uint32_t)uVar9,TVar5,local_28);
    break;
  case CPPTYPE_UINT64:
    bVar2 = UninterpretedOption::has_positive_int_value(this->uninterpreted_option_);
    if (!bVar2) {
      aStack_e8.option_field = (FieldDescriptor **)&unknown_fields_local;
      absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__7,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_e0,&stack0xffffffffffffff18);
      this_local._7_1_ = AddValueError(this,local_e0);
      goto LAB_0025cc0e;
    }
    iVar7 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
    uVar9 = UninterpretedOption::positive_int_value(this->uninterpreted_option_);
    TVar5 = FieldDescriptor::type((FieldDescriptor *)unknown_fields_local);
    SetUInt64(this,iVar7,uVar9,TVar5,local_28);
    break;
  case CPPTYPE_DOUBLE:
    bVar2 = UninterpretedOption::has_double_value(this->uninterpreted_option_);
    if (bVar2) {
      local_110 = UninterpretedOption::double_value(this->uninterpreted_option_);
    }
    else {
      bVar2 = UninterpretedOption::has_positive_int_value(this->uninterpreted_option_);
      if (bVar2) {
        uVar9 = UninterpretedOption::positive_int_value(this->uninterpreted_option_);
        auVar17._8_4_ = (int)(uVar9 >> 0x20);
        auVar17._0_8_ = uVar9;
        auVar17._12_4_ = 0x45300000;
        local_110 = (auVar17._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
      }
      else {
        bVar2 = UninterpretedOption::has_negative_int_value(this->uninterpreted_option_);
        if (bVar2) {
          iVar10 = UninterpretedOption::negative_int_value(this->uninterpreted_option_);
          local_110 = (double)iVar10;
        }
        else {
          psVar15 = UninterpretedOption::identifier_value_abi_cxx11_(this->uninterpreted_option_);
          bVar2 = std::operator==(psVar15,"inf");
          if (bVar2) {
            local_110 = std::numeric_limits<double>::infinity();
          }
          else {
            psVar15 = UninterpretedOption::identifier_value_abi_cxx11_(this->uninterpreted_option_);
            bVar2 = std::operator==(psVar15,"nan");
            if (!bVar2) {
              value = (uint64_t)&unknown_fields_local;
              absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
              FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__9,void>
                        ((FunctionRef<std::__cxx11::string()> *)&local_120,
                         (anon_class_8_1_8974feae *)&value);
              this_local._7_1_ = AddValueError(this,local_120);
              goto LAB_0025cc0e;
            }
            local_110 = std::numeric_limits<double>::quiet_NaN();
          }
        }
      }
    }
    pUVar1 = local_28;
    iVar7 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
    uVar9 = internal::WireFormatLite::EncodeDouble(local_110);
    UnknownFieldSet::AddFixed64(pUVar1,iVar7,uVar9);
    break;
  case CPPTYPE_FLOAT:
    bVar2 = UninterpretedOption::has_double_value(this->uninterpreted_option_);
    if (bVar2) {
      dVar16 = UninterpretedOption::double_value(this->uninterpreted_option_);
      local_ec = (float)dVar16;
    }
    else {
      bVar2 = UninterpretedOption::has_positive_int_value(this->uninterpreted_option_);
      if (bVar2) {
        uVar9 = UninterpretedOption::positive_int_value(this->uninterpreted_option_);
        local_2e0 = (float)uVar9;
        local_ec = local_2e0;
      }
      else {
        bVar2 = UninterpretedOption::has_negative_int_value(this->uninterpreted_option_);
        if (bVar2) {
          iVar10 = UninterpretedOption::negative_int_value(this->uninterpreted_option_);
          local_ec = (float)iVar10;
        }
        else {
          psVar15 = UninterpretedOption::identifier_value_abi_cxx11_(this->uninterpreted_option_);
          bVar2 = std::operator==(psVar15,"inf");
          if (bVar2) {
            local_ec = std::numeric_limits<float>::infinity();
          }
          else {
            psVar15 = UninterpretedOption::identifier_value_abi_cxx11_(this->uninterpreted_option_);
            bVar2 = std::operator==(psVar15,"nan");
            if (!bVar2) {
              value_2 = (double)&unknown_fields_local;
              absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
              FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__8,void>
                        ((FunctionRef<std::__cxx11::string()> *)&local_100,
                         (anon_class_8_1_8974feae *)&value_2);
              this_local._7_1_ = AddValueError(this,local_100);
              goto LAB_0025cc0e;
            }
            local_ec = std::numeric_limits<float>::quiet_NaN();
          }
        }
      }
    }
    pUVar1 = local_28;
    iVar7 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
    value_00 = internal::WireFormatLite::EncodeFloat(local_ec);
    UnknownFieldSet::AddFixed32(pUVar1,iVar7,value_00);
    break;
  case CPPTYPE_BOOL:
    bVar2 = UninterpretedOption::has_identifier_value(this->uninterpreted_option_);
    if (!bVar2) {
      local_148.option_field = (FieldDescriptor **)&unknown_fields_local;
      absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__10,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_140,&local_148);
      this_local._7_1_ = AddValueError(this,local_140);
      goto LAB_0025cc0e;
    }
    psVar15 = UninterpretedOption::identifier_value_abi_cxx11_(this->uninterpreted_option_);
    bVar2 = std::operator==(psVar15,"true");
    if (bVar2) {
      local_130 = 1;
    }
    else {
      psVar15 = UninterpretedOption::identifier_value_abi_cxx11_(this->uninterpreted_option_);
      bVar2 = std::operator==(psVar15,"false");
      if (!bVar2) {
        local_160.option_field = (FieldDescriptor **)&unknown_fields_local;
        absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__11,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_158,&local_160);
        this_local._7_1_ = AddValueError(this,local_158);
        goto LAB_0025cc0e;
      }
      local_130 = 0;
    }
    pUVar1 = local_28;
    iVar7 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
    UnknownFieldSet::AddVarint(pUVar1,iVar7,local_130);
    break;
  case CPPTYPE_ENUM:
    bVar2 = UninterpretedOption::has_identifier_value(this->uninterpreted_option_);
    if (!bVar2) {
      enum_type = (EnumDescriptor *)&unknown_fields_local;
      absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__12,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_170,
                 (anon_class_8_1_8974feae *)&enum_type);
      this_local._7_1_ = AddValueError(this,local_170);
      goto LAB_0025cc0e;
    }
    value_name = (string *)FieldDescriptor::enum_type((FieldDescriptor *)unknown_fields_local);
    this_01 = UninterpretedOption::identifier_value_abi_cxx11_(this->uninterpreted_option_);
    fully_qualified_name.field_2._8_8_ = 0;
    this_02 = EnumDescriptor::file((EnumDescriptor *)value_name);
    pDVar11 = FileDescriptor::pool(this_02);
    pDVar12 = DescriptorPool::generated_pool();
    psVar15 = value_name;
    if (pDVar11 == pDVar12) {
      local_220 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
      fully_qualified_name.field_2._8_8_ =
           EnumDescriptor::FindValueByName((EnumDescriptor *)psVar15,local_220);
    }
    else {
      psVar13 = EnumDescriptor::full_name_abi_cxx11_((EnumDescriptor *)value_name);
      std::__cxx11::string::string(local_1b0,(string *)psVar13);
      std::__cxx11::string::size();
      EnumDescriptor::name_abi_cxx11_((EnumDescriptor *)value_name);
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)local_1b0);
      std::__cxx11::string::operator+=(local_1b0,(string *)this_01);
      this_00 = this->builder_;
      sVar18 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_1b0);
      local_1d0 = sVar18._M_str;
      candidate_descriptor = (EnumValueDescriptor *)sVar18._M_len;
      local_1c8 = FindSymbolNotEnforcingDeps(this_00,sVar18,true);
      local_1e0 = Symbol::enum_value_descriptor(&local_1c8);
      if (local_1e0 == (EnumValueDescriptor *)0x0) {
LAB_0025ca24:
        local_20c = 0;
      }
      else {
        pEVar14 = EnumValueDescriptor::type(local_1e0);
        if (pEVar14 == (EnumDescriptor *)value_name) {
          fully_qualified_name.field_2._8_8_ = local_1e0;
          goto LAB_0025ca24;
        }
        local_208.enum_type = (EnumDescriptor **)&value_name;
        local_208.option_field = (FieldDescriptor **)&unknown_fields_local;
        local_208.value_name = this_01;
        absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__13,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_1f0,&local_208);
        this_local._7_1_ = AddValueError(this,local_1f0);
        local_20c = 1;
      }
      std::__cxx11::string::~string(local_1b0);
      if (local_20c != 0) goto LAB_0025cc0e;
    }
    pUVar1 = local_28;
    if (fully_qualified_name.field_2._8_8_ == 0) {
      local_240.option_field = (FieldDescriptor **)&unknown_fields_local;
      local_240.value_name = this_01;
      absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__14,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_230,&local_240);
      this_local._7_1_ = AddValueError(this,local_230);
      goto LAB_0025cc0e;
    }
    iVar7 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
    iVar6 = EnumValueDescriptor::number((EnumValueDescriptor *)fully_qualified_name.field_2._8_8_);
    UnknownFieldSet::AddVarint(pUVar1,iVar7,(long)iVar6);
    break;
  case CPPTYPE_STRING:
    bVar2 = UninterpretedOption::has_string_value(this->uninterpreted_option_);
    pUVar1 = local_28;
    if (!bVar2) {
      local_258.option_field = (FieldDescriptor **)&unknown_fields_local;
      absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__15,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_250,&local_258);
      this_local._7_1_ = AddValueError(this,local_250);
      goto LAB_0025cc0e;
    }
    iVar7 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
    psVar15 = UninterpretedOption::string_value_abi_cxx11_(this->uninterpreted_option_);
    sVar18 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar15);
    UnknownFieldSet::AddLengthDelimited(pUVar1,iVar7,sVar18);
    break;
  case CPPTYPE_MESSAGE:
    bVar2 = SetAggregateOption(this,(FieldDescriptor *)unknown_fields_local,local_28);
    if (!bVar2) {
      this_local._7_1_ = 0;
      goto LAB_0025cc0e;
    }
  }
  this_local._7_1_ = 1;
LAB_0025cc0e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetOptionValue(
    const FieldDescriptor* option_field, UnknownFieldSet* unknown_fields) {
  // We switch on the CppType to validate.
  switch (option_field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64_t>(std::numeric_limits<int32_t>::max())) {
          return AddValueError([&] {
            return ValueOutOfRange<int32_t>("int32", option_field->full_name());
          });
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        if (uninterpreted_option_->negative_int_value() <
            static_cast<int64_t>(std::numeric_limits<int32_t>::min())) {
          return AddValueError([&] {
            return ValueOutOfRange<int32_t>("int32", option_field->full_name());
          });
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->negative_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<int32_t>("int32", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_INT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64_t>(std::numeric_limits<int64_t>::max())) {
          return AddValueError([&] {
            return ValueOutOfRange<int64_t>("int64", option_field->full_name());
          });
        } else {
          SetInt64(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        SetInt64(option_field->number(),
                 uninterpreted_option_->negative_int_value(),
                 option_field->type(), unknown_fields);
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<int64_t>("int64", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            std::numeric_limits<uint32_t>::max()) {
          return AddValueError([&] {
            return ValueOutOfRange<uint32_t>("uint32",
                                             option_field->full_name());
          });
        } else {
          SetUInt32(option_field->number(),
                    uninterpreted_option_->positive_int_value(),
                    option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<uint32_t>("uint32", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        SetUInt64(option_field->number(),
                  uninterpreted_option_->positive_int_value(),
                  option_field->type(), unknown_fields);
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<uint64_t>("uint64", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else if (uninterpreted_option_->identifier_value() == "inf") {
        value = std::numeric_limits<float>::infinity();
      } else if (uninterpreted_option_->identifier_value() == "nan") {
        value = std::numeric_limits<float>::quiet_NaN();
      } else {
        return AddValueError([&] {
          return absl::StrCat("Value must be number for float option \"",
                              option_field->full_name(), "\".");
        });
      }
      unknown_fields->AddFixed32(option_field->number(),
                                 internal::WireFormatLite::EncodeFloat(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else if (uninterpreted_option_->identifier_value() == "inf") {
        value = std::numeric_limits<double>::infinity();
      } else if (uninterpreted_option_->identifier_value() == "nan") {
        value = std::numeric_limits<double>::quiet_NaN();
      } else {
        return AddValueError([&] {
          return absl::StrCat("Value must be number for double option \"",
                              option_field->full_name(), "\".");
        });
      }
      unknown_fields->AddFixed64(option_field->number(),
                                 internal::WireFormatLite::EncodeDouble(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_BOOL:
      uint64_t value;
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError([&] {
          return absl::StrCat("Value must be identifier for boolean option \"",
                              option_field->full_name(), "\".");
        });
      }
      if (uninterpreted_option_->identifier_value() == "true") {
        value = 1;
      } else if (uninterpreted_option_->identifier_value() == "false") {
        value = 0;
      } else {
        return AddValueError([&] {
          return absl::StrCat(
              "Value must be \"true\" or \"false\" for boolean option \"",
              option_field->full_name(), "\".");
        });
      }
      unknown_fields->AddVarint(option_field->number(), value);
      break;

    case FieldDescriptor::CPPTYPE_ENUM: {
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError([&] {
          return absl::StrCat(
              "Value must be identifier for enum-valued option \"",
              option_field->full_name(), "\".");
        });
      }
      const EnumDescriptor* enum_type = option_field->enum_type();
      const std::string& value_name = uninterpreted_option_->identifier_value();
      const EnumValueDescriptor* enum_value = nullptr;

      if (enum_type->file()->pool() != DescriptorPool::generated_pool()) {
        // Note that the enum value's fully-qualified name is a sibling of the
        // enum's name, not a child of it.
        std::string fully_qualified_name = std::string(enum_type->full_name());
        fully_qualified_name.resize(fully_qualified_name.size() -
                                    enum_type->name().size());
        fully_qualified_name += value_name;

        // Search for the enum value's descriptor in the builder's pool. Note
        // that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
        // DescriptorPool::FindEnumValueByName() because we're already holding
        // the pool's mutex, and the latter method locks it again.
        Symbol symbol =
            builder_->FindSymbolNotEnforcingDeps(fully_qualified_name);
        if (auto* candidate_descriptor = symbol.enum_value_descriptor()) {
          if (candidate_descriptor->type() != enum_type) {
            return AddValueError([&] {
              return absl::StrCat(
                  "Enum type \"", enum_type->full_name(),
                  "\" has no value named \"", value_name, "\" for option \"",
                  option_field->full_name(),
                  "\". This appears to be a value from a sibling type.");
            });
          } else {
            enum_value = candidate_descriptor;
          }
        }
      } else {
        // The enum type is in the generated pool, so we can search for the
        // value there.
        enum_value = enum_type->FindValueByName(value_name);
      }

      if (enum_value == nullptr) {
        return AddValueError([&] {
          return absl::StrCat(
              "Enum type \"", option_field->enum_type()->full_name(),
              "\" has no value named \"", value_name, "\" for option \"",
              option_field->full_name(), "\".");
        });
      } else {
        // Sign-extension is not a problem, since we cast directly from int32_t
        // to uint64_t, without first going through uint32_t.
        unknown_fields->AddVarint(
            option_field->number(),
            static_cast<uint64_t>(static_cast<int64_t>(enum_value->number())));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_STRING:
      if (!uninterpreted_option_->has_string_value()) {
        return AddValueError([&] {
          return absl::StrCat(
              "Value must be quoted string for string option \"",
              option_field->full_name(), "\".");
        });
      }
      // The string has already been unquoted and unescaped by the parser.
      unknown_fields->AddLengthDelimited(option_field->number(),
                                         uninterpreted_option_->string_value());
      break;

    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (!SetAggregateOption(option_field, unknown_fields)) {
        return false;
      }
      break;
  }

  return true;
}